

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chromosome.h
# Opt level: O1

Chromosome * __thiscall
tsp::Chromosome::crossover
          (Chromosome *__return_storage_ptr__,Chromosome *this,Chromosome *chromosome,uint pcross)

{
  pointer __s;
  pointer piVar1;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Var2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  ulong __new_size;
  value_type value;
  int local_3c;
  vector<int,_std::allocator<int>_> *local_38;
  
  Chromosome(__return_storage_ptr__);
  __new_size = (long)(this->values).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)(this->values).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start >> 2;
  local_38 = &__return_storage_ptr__->values;
  std::vector<int,_std::allocator<int>_>::resize(local_38,__new_size);
  __s = (__return_storage_ptr__->values).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start;
  piVar1 = (__return_storage_ptr__->values).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (__s != piVar1) {
    memset(__s,0,((long)piVar1 + (-4 - (long)__s) & 0xfffffffffffffffcU) + 4);
  }
  if (pcross == 0) {
    uVar4 = 0;
    uVar5 = 0;
  }
  else {
    piVar1 = (this->values).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar5 = 0;
    do {
      __s[uVar5] = piVar1[uVar5];
      uVar5 = uVar5 + 1;
    } while (pcross != uVar5);
    uVar4 = uVar5 & 0xffffffff;
  }
  while( true ) {
    iVar3 = (int)uVar4;
    if (__new_size <= (ulong)(long)iVar3) break;
    local_3c = (chromosome->values).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start[uVar5 % __new_size];
    _Var2 = std::
            __find_if<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_equals_val<int_const>>
                      ((__return_storage_ptr__->values).
                       super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                       ._M_start,
                       (__return_storage_ptr__->values).
                       super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                       ._M_finish,&local_3c);
    if (_Var2._M_current ==
        (__return_storage_ptr__->values).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      (local_38->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_start[iVar3] = local_3c;
      uVar4 = (ulong)(iVar3 + 1);
    }
    uVar5 = uVar5 + 1;
  }
  return __return_storage_ptr__;
}

Assistant:

Chromosome Chromosome::crossover(const Chromosome &chromosome, unsigned int pcross) {
        Chromosome child = Chromosome();

        auto size = this->values.size();
        child.values.resize(size);

        std::fill(child.values.begin(), child.values.end(), 0);

        int indexC = 0;
        int indexP = 0;

        for (indexP = 0; indexP < pcross; ++indexP) {
            child.values[indexC] = this->values[indexP];
            ++indexC;
        }

        while (indexC < size) {
            auto value = chromosome.values[indexP % size];
            auto it = std::find(child.values.begin(), child.values.end(), value);

            if (it == child.values.end()) {
                child.values[indexC] = value;
                ++indexC;
            }

            ++indexP;
        }

        return child;
    }